

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O2

resolve_t Curl_resolv(connectdata *conn,char *hostname,int port,_Bool allowDOH,
                     Curl_dns_entry **entry)

{
  Curl_easy *data;
  _Bool _Var1;
  int iVar2;
  CURLcode CVar3;
  Curl_dns_entry *pCVar4;
  Curl_addrinfo *addr;
  undefined7 in_register_00000009;
  resolve_t local_58;
  int respwait;
  Curl_dns_entry *local_50;
  undefined4 local_48;
  in_addr in;
  in6_addr in6;
  
  local_48 = (undefined4)CONCAT71(in_register_00000009,allowDOH);
  data = conn->data;
  *entry = (Curl_dns_entry *)0x0;
  if (data->share != (Curl_share *)0x0) {
    Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
  }
  pCVar4 = fetch_addr(conn,hostname,port);
  local_50 = pCVar4;
  if (pCVar4 == (Curl_dns_entry *)0x0) {
    local_58 = CURLRESOLV_ERROR;
  }
  else {
    local_58 = CURLRESOLV_RESOLVED;
    Curl_infof(data,"Hostname %s was found in DNS cache\n",hostname);
    pCVar4->inuse = pCVar4->inuse + 1;
  }
  if (data->share != (Curl_share *)0x0) {
    Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
  }
  if (pCVar4 != (Curl_dns_entry *)0x0) goto LAB_0010b60d;
  respwait = 0;
  if ((data->set).resolver_start == (curl_resolver_start_callback)0x0) {
LAB_0010b664:
    iVar2 = inet_pton(2,hostname,&in);
    if (((iVar2 < 1) || (addr = Curl_ip2addr(2,&in,hostname,port), addr == (Curl_addrinfo *)0x0)) &&
       ((iVar2 = inet_pton(10,hostname,&in6), iVar2 < 1 ||
        (addr = Curl_ip2addr(10,&in6,hostname,port), addr == (Curl_addrinfo *)0x0)))) {
      _Var1 = Curl_ipvalid(conn);
      if (!_Var1) goto LAB_0010b78f;
      if (((char)local_48 == '\0') || (((data->set).field_0x8ee & 0x80) == 0)) {
        addr = Curl_getaddrinfo(conn,hostname,port,&respwait);
      }
      else {
        addr = Curl_doh(conn,hostname,port,&respwait);
      }
      if (addr != (Curl_addrinfo *)0x0) goto LAB_0010b6bf;
      if (respwait == 0) {
        pCVar4 = (Curl_dns_entry *)0x0;
      }
      else {
        CVar3 = Curl_resolv_check(conn,&local_50);
        if (CVar3 != CURLE_OK) goto LAB_0010b78f;
        local_58 = (resolve_t)(local_50 == (Curl_dns_entry *)0x0);
        pCVar4 = local_50;
      }
    }
    else {
LAB_0010b6bf:
      if (data->share != (Curl_share *)0x0) {
        Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
      }
      pCVar4 = Curl_cache_addr(data,addr,hostname,port);
      local_50 = pCVar4;
      if (data->share != (Curl_share *)0x0) {
        Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
      }
      if (pCVar4 == (Curl_dns_entry *)0x0) {
        Curl_freeaddrinfo(addr);
        pCVar4 = local_50;
      }
      else {
        local_58 = CURLRESOLV_RESOLVED;
      }
    }
LAB_0010b60d:
    *entry = pCVar4;
  }
  else {
    Curl_set_in_callback(data,true);
    iVar2 = (*(data->set).resolver_start)
                      ((data->state).resolver,(void *)0x0,(data->set).resolver_start_client);
    Curl_set_in_callback(data,false);
    if (iVar2 == 0) goto LAB_0010b664;
LAB_0010b78f:
    local_58 = CURLRESOLV_ERROR;
  }
  return local_58;
}

Assistant:

enum resolve_t Curl_resolv(struct connectdata *conn,
                           const char *hostname,
                           int port,
                           bool allowDOH,
                           struct Curl_dns_entry **entry)
{
  struct Curl_dns_entry *dns = NULL;
  struct Curl_easy *data = conn->data;
  CURLcode result;
  enum resolve_t rc = CURLRESOLV_ERROR; /* default to failure */

  *entry = NULL;

  if(data->share)
    Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

  dns = fetch_addr(conn, hostname, port);

  if(dns) {
    infof(data, "Hostname %s was found in DNS cache\n", hostname);
    dns->inuse++; /* we use it! */
    rc = CURLRESOLV_RESOLVED;
  }

  if(data->share)
    Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

  if(!dns) {
    /* The entry was not in the cache. Resolve it to IP address */

    Curl_addrinfo *addr = NULL;
    int respwait = 0;
#ifndef USE_RESOLVE_ON_IPS
    struct in_addr in;
#endif

    /* notify the resolver start callback */
    if(data->set.resolver_start) {
      int st;
      Curl_set_in_callback(data, true);
      st = data->set.resolver_start(data->state.resolver, NULL,
                                    data->set.resolver_start_client);
      Curl_set_in_callback(data, false);
      if(st)
        return CURLRESOLV_ERROR;
    }

#ifndef USE_RESOLVE_ON_IPS
    /* First check if this is an IPv4 address string */
    if(Curl_inet_pton(AF_INET, hostname, &in) > 0)
      /* This is a dotted IP address 123.123.123.123-style */
      addr = Curl_ip2addr(AF_INET, &in, hostname, port);
#ifdef ENABLE_IPV6
    if(!addr) {
      struct in6_addr in6;
      /* check if this is an IPv6 address string */
      if(Curl_inet_pton(AF_INET6, hostname, &in6) > 0)
        /* This is an IPv6 address literal */
        addr = Curl_ip2addr(AF_INET6, &in6, hostname, port);
    }
#endif /* ENABLE_IPV6 */
#endif /* !USE_RESOLVE_ON_IPS */

    if(!addr) {
      /* Check what IP specifics the app has requested and if we can provide
       * it. If not, bail out. */
      if(!Curl_ipvalid(conn))
        return CURLRESOLV_ERROR;

      if(allowDOH && data->set.doh) {
        addr = Curl_doh(conn, hostname, port, &respwait);
      }
      else {
        /* If Curl_getaddrinfo() returns NULL, 'respwait' might be set to a
           non-zero value indicating that we need to wait for the response to
           the resolve call */
        addr = Curl_getaddrinfo(conn,
#ifdef DEBUGBUILD
                                (data->set.str[STRING_DEVICE]
                                 && !strcmp(data->set.str[STRING_DEVICE],
                                            "LocalHost"))?"localhost":
#endif
                                hostname, port, &respwait);
      }
    }
    if(!addr) {
      if(respwait) {
        /* the response to our resolve call will come asynchronously at
           a later time, good or bad */
        /* First, check that we haven't received the info by now */
        result = Curl_resolv_check(conn, &dns);
        if(result) /* error detected */
          return CURLRESOLV_ERROR;
        if(dns)
          rc = CURLRESOLV_RESOLVED; /* pointer provided */
        else
          rc = CURLRESOLV_PENDING; /* no info yet */
      }
    }
    else {
      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* we got a response, store it in the cache */
      dns = Curl_cache_addr(data, addr, hostname, port);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns)
        /* returned failure, bail out nicely */
        Curl_freeaddrinfo(addr);
      else
        rc = CURLRESOLV_RESOLVED;
    }
  }

  *entry = dns;

  return rc;
}